

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzio.c
# Opt level: O1

uLong getLong(gz_stream *s)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar1 = get_byte(s);
  iVar2 = get_byte(s);
  iVar3 = get_byte(s);
  iVar4 = get_byte(s);
  if (iVar4 == -1) {
    s->z_err = -3;
  }
  return (long)iVar4 * 0x1000000 + (long)iVar3 * 0x10000 + (long)iVar1 + (long)iVar2 * 0x100;
}

Assistant:

local uLong getLong (s)
    gz_stream *s;
{
    uLong x = (uLong)get_byte(s);
    int c;

    x += ((uLong)get_byte(s))<<8;
    x += ((uLong)get_byte(s))<<16;
    c = get_byte(s);
    if (c == EOF) s->z_err = Z_DATA_ERROR;
    x += ((uLong)c)<<24;
    return x;
}